

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall cmCTestBZR::~cmCTestBZR(cmCTestBZR *this)

{
  cmCTestBZR *this_local;
  
  ~cmCTestBZR(this);
  operator_delete(this,0x330);
  return;
}

Assistant:

cmCTestBZR::~cmCTestBZR() = default;